

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDockableDragDropSource(ImGuiWindow *window)

{
  float x2;
  ImGuiContext *pIVar1;
  bool bVar2;
  float y2;
  bool local_2d;
  ImRect local_2c;
  bool local_19;
  ImGuiContext *pIStack_18;
  bool is_drag_docking;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  pIStack_18 = GImGui;
  g = (ImGuiContext *)window;
  if (GImGui->ActiveId != window->MoveId) {
    __assert_fail("g.ActiveId == window->MoveId",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x39f8,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->MovingWindow != window) {
    __assert_fail("g.MovingWindow == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x39f9,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  (window->DC).LastItemId = window->MoveId;
  g = (ImGuiContext *)window->RootWindow;
  if (((g->IO).BackendFlags & 0x200000U) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x39fd,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  local_2d = true;
  if (((pIVar1->IO).ConfigDockingWithShift & 1U) == 0) {
    x2 = *(float *)((long)((ImVec2 *)(g->IO).KeyMap + 3) + 4);
    y2 = GetFrameHeight();
    ImRect::ImRect(&local_2c,0.0,0.0,x2,y2);
    local_2d = ImRect::Contains(&local_2c,&pIStack_18->ActiveIdClickOffset);
  }
  local_19 = local_2d;
  if ((local_2d != false) && (bVar2 = BeginDragDropSource(0x25), bVar2)) {
    SetDragDropPayload("_IMWINDOW",&g,8,0);
    EndDragDropSource();
  }
  return;
}

Assistant:

void ImGui::BeginDockableDragDropSource(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == window->MoveId);
    IM_ASSERT(g.MovingWindow == window);

    window->DC.LastItemId = window->MoveId;
    window = window->RootWindow;
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    bool is_drag_docking = (g.IO.ConfigDockingWithShift) || ImRect(0, 0, window->SizeFull.x, GetFrameHeight()).Contains(g.ActiveIdClickOffset);
    if (is_drag_docking && BeginDragDropSource(ImGuiDragDropFlags_SourceNoPreviewTooltip | ImGuiDragDropFlags_SourceNoHoldToOpenOthers | ImGuiDragDropFlags_SourceAutoExpirePayload))
    {
        SetDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, &window, sizeof(window));
        EndDragDropSource();
    }
}